

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

void dummy_Op_EnsureNoRedeclPropertyScoped(void)

{
  return;
}

Assistant:

Var JavascriptOperators::IsIn(Var argProperty, Var instance, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_IsIn);
        // Note that the fact that we haven't seen a given name before doesn't mean that the instance doesn't

        if (!IsObject(instance))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Operand_Invalid_NeedObject, _u("in"));
        }

        RecyclableObject* object = VarTo<RecyclableObject>(instance);
        BOOL result;
        PropertyRecord const * propertyRecord = nullptr;
        uint32 index;
        IndexType indexType;

        // Fast path for JavascriptSymbols and PropertyStrings
        RecyclableObject* cacheOwner;
        PropertyRecordUsageCache* propertyRecordUsageCache;
        if (GetPropertyRecordUsageCache(argProperty, scriptContext, &propertyRecordUsageCache, &cacheOwner))
        {
            Var value;
            propertyRecord = propertyRecordUsageCache->GetPropertyRecord();
            if (!propertyRecord->IsNumeric())
            {
                PropertyValueInfo info;
                if (propertyRecordUsageCache->TryGetPropertyFromCache<false /* OwnPropertyOnly */, true /* OutputExistence */, false /* ReturnOperationInfo */>(instance, object, &value, scriptContext, &info, cacheOwner, nullptr))
                {
                    Assert(VarIs<JavascriptBoolean>(value));
                    return value;
                }
                result = JavascriptOperators::GetPropertyWPCache<true /* OutputExistence */>(instance, object, propertyRecordUsageCache->GetPropertyRecord()->GetPropertyId(), &value, scriptContext, &info);
                Assert(value == JavascriptBoolean::ToVar(result, scriptContext));
                return value;
            }

            // We don't cache numeric property lookups, so fall through to the IndexType_Number case
            index = propertyRecord->GetNumericValue();
            indexType = IndexType_Number;
        }
        else
        {
            indexType = GetIndexType(argProperty, scriptContext, &index, &propertyRecord, true);
        }

        if (indexType == IndexType_Number)
        {
            result = JavascriptOperators::HasItem(object, index);
        }
        else
        {
            result = JavascriptOperators::HasProperty(object, propertyRecord->GetPropertyId());

#ifdef TELEMETRY_JSO
            {
                Assert(indexType != Js::IndexType_JavascriptString);
                if (indexType == Js::IndexType_PropertyId)
                {
                    scriptContext->GetTelemetry().GetOpcodeTelemetry().IsIn(instance, propertyId, result != 0);
                }
            }
#endif
        }
        return JavascriptBoolean::ToVar(result, scriptContext);
        JIT_HELPER_END(Op_IsIn);
    }